

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpAcceptor::logger(TcpAcceptor *this,int logLevel,string *message)

{
  ostream *poVar1;
  
  if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->logFunction,logLevel,message);
    return;
  }
  if (logLevel != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)message);
    std::operator<<(poVar1,'\n');
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void TcpAcceptor::logger(int logLevel, const std::string& message)
{
    if (logFunction) {
        logFunction(logLevel, message);
    } else {
        if (logLevel == 0) {
            std::cerr << message << std::endl;
        } else {
            std::cout << message << '\n';
        }
    }
}